

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *p_data,char *format)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined2 uVar4;
  int iVar5;
  float fVar6;
  ulong uVar7;
  byte bVar8;
  double dVar9;
  int arg0i;
  float arg1f;
  int arg1i;
  ImGuiDataTypeTempStorage data_backup;
  double local_70;
  double *local_68;
  undefined8 local_60;
  size_t local_58;
  float local_4c;
  char *local_48;
  ulong local_40;
  undefined1 local_38 [8];
  
  while( true ) {
    bVar1 = *buf;
    uVar7 = (ulong)bVar1;
    if (0x2f < uVar7) break;
    if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
      if ((0x8c0000000000U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0015a69b;
      break;
    }
    buf = (char *)((byte *)buf + 1);
  }
  bVar8 = 0;
  bVar2 = bVar1;
LAB_0015a6b4:
  if (bVar2 == 0) {
    return false;
  }
  local_48 = initial_value_buf;
  if (9 < (uint)data_type) {
    __assert_fail("data_type >= 0 && data_type < ImGuiDataType_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_widgets.cpp"
                  ,0x6e3,"const ImGuiDataTypeInfo *ImGui::DataTypeGetInfo(ImGuiDataType)");
  }
  uVar7 = (ulong)(uint)data_type;
  local_58 = GDataTypeInfo[uVar7].Size;
  local_68 = (double *)p_data;
  local_40 = uVar7;
  memcpy(local_38,p_data,local_58);
  if (format == (char *)0x0) {
    format = GDataTypeInfo[uVar7].ScanFmt;
  }
  local_4c = 0.0;
  if (data_type == 9) {
    local_70 = *local_68;
    local_60 = 0.0;
    if ((bVar8 != 0) && (iVar5 = __isoc99_sscanf(local_48,"%lf",&local_70), iVar5 < 1)) {
      return false;
    }
    iVar5 = __isoc99_sscanf(buf,"%lf",&local_60);
    if (iVar5 < 1) {
      return false;
    }
    if (bVar8 == 0x2a) {
      dVar9 = local_70 * local_60;
    }
    else if (bVar8 == 0x2f) {
      if ((local_60 == 0.0) && (!NAN(local_60))) goto LAB_0015aafd;
      dVar9 = local_70 / local_60;
    }
    else {
      dVar9 = local_60;
      if (bVar8 == 0x2b) {
        dVar9 = local_70 + local_60;
      }
    }
    *local_68 = dVar9;
    goto LAB_0015aafd;
  }
  if (data_type == 8) {
    local_70 = (double)CONCAT44(local_70._4_4_,*(float *)local_68);
    local_60 = (double)((ulong)local_60._4_4_ << 0x20);
    if ((bVar8 != 0) && (iVar5 = __isoc99_sscanf(local_48,"%f",&local_70), iVar5 < 1)) {
      return false;
    }
    iVar5 = __isoc99_sscanf(buf,"%f",&local_60);
    if (iVar5 < 1) {
      return false;
    }
    if (bVar8 == 0x2a) {
      fVar6 = local_70._0_4_ * (float)local_60;
    }
    else if (bVar8 == 0x2f) {
      if (((float)local_60 == 0.0) && (!NAN((float)local_60))) goto LAB_0015aafd;
      fVar6 = local_70._0_4_ / (float)local_60;
    }
    else {
      fVar6 = (float)local_60;
      if (bVar8 == 0x2b) {
        fVar6 = local_70._0_4_ + (float)local_60;
      }
    }
    *(float *)local_68 = fVar6;
    goto LAB_0015aafd;
  }
  if (data_type == 4) {
    local_70 = (double)CONCAT44(local_70._4_4_,*(float *)local_68);
    local_60 = (double)((ulong)local_60._4_4_ << 0x20);
    if (bVar8 == 0) {
LAB_0015a95a:
      iVar5 = __isoc99_sscanf(buf,format,&local_4c);
      fVar6 = local_4c;
      if (iVar5 != 1) goto LAB_0015aafd;
    }
    else {
      iVar5 = __isoc99_sscanf(local_48,format,&local_70);
      if (iVar5 < 1) {
        return false;
      }
      if (bVar8 == 0x2a) {
        iVar5 = __isoc99_sscanf(buf,"%f",&local_60);
        if (iVar5 == 0) goto LAB_0015aafd;
        fVar6 = (float)(int)((float)(int)local_70._0_4_ * (float)local_60);
      }
      else if (bVar8 == 0x2f) {
        iVar5 = __isoc99_sscanf(buf,"%f",&local_60);
        if (iVar5 == 0) goto LAB_0015aafd;
        if (((float)local_60 == 0.0) && (!NAN((float)local_60))) goto LAB_0015aafd;
        fVar6 = (float)(int)((float)(int)local_70._0_4_ / (float)local_60);
      }
      else {
        if (bVar8 != 0x2b) goto LAB_0015a95a;
        iVar5 = __isoc99_sscanf(buf,"%d",&local_4c);
        if (iVar5 == 0) goto LAB_0015aafd;
        fVar6 = (float)((int)local_4c + (int)local_70._0_4_);
      }
    }
    *(float *)local_68 = fVar6;
    goto LAB_0015aafd;
  }
  if (data_type - 5U < 3) {
    __isoc99_sscanf(buf,format);
    goto LAB_0015aafd;
  }
  __isoc99_sscanf(buf,format,&local_70);
  if (3 < (uint)data_type) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_widgets.cpp"
                  ,0x78f,
                  "bool ImGui::DataTypeApplyOpFromText(const char *, const char *, ImGuiDataType, void *, const char *)"
                 );
  }
  switch((long)&switchD_0015a939::switchdataD_00198a90 +
         (long)(int)(&switchD_0015a939::switchdataD_00198a90)[local_40]) {
  case 0x15a93b:
    iVar5 = 0x7f;
    if ((int)local_70._0_4_ < 0x7f) {
      iVar5 = (int)local_70._0_4_;
    }
    uVar3 = 0x80;
    if (-0x80 < iVar5) {
      uVar3 = (undefined1)iVar5;
    }
    break;
  case 0x15a988:
    iVar5 = 0x7fff;
    if ((int)local_70._0_4_ < 0x7fff) {
      iVar5 = (int)local_70._0_4_;
    }
    uVar4 = 0x8000;
    if (-0x8000 < iVar5) {
      uVar4 = (undefined2)iVar5;
    }
    goto LAB_0015a9bb;
  case 0x15a9a6:
    iVar5 = 0xffff;
    if ((int)local_70._0_4_ < 0xffff) {
      iVar5 = (int)local_70._0_4_;
    }
    uVar4 = 0;
    if (0 < iVar5) {
      uVar4 = (undefined2)iVar5;
    }
LAB_0015a9bb:
    *(undefined2 *)local_68 = uVar4;
    goto LAB_0015aafd;
  case 0x15a9c8:
    iVar5 = 0xff;
    if ((int)local_70._0_4_ < 0xff) {
      iVar5 = (int)local_70._0_4_;
    }
    uVar3 = 0;
    if (0 < iVar5) {
      uVar3 = (undefined1)iVar5;
    }
  }
  *(undefined1 *)local_68 = uVar3;
LAB_0015aafd:
  iVar5 = bcmp(local_38,local_68,local_58);
  return iVar5 != 0;
LAB_0015a69b:
  do {
    do {
      buf = (char *)((byte *)buf + 1);
      bVar2 = *buf;
    } while (bVar2 == 0x20);
    bVar8 = bVar1;
  } while (bVar2 == 9);
  goto LAB_0015a6b4;
}

Assistant:

bool ImGui::DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    const ImGuiDataTypeInfo* type_info = DataTypeGetInfo(data_type);
    ImGuiDataTypeTempStorage data_backup;
    memcpy(&data_backup, p_data, type_info->Size);

    if (format == NULL)
        format = type_info->ScanFmt;

    // FIXME-LEGACY: The aim is to remove those operators and write a proper expression evaluator at some point..
    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)p_data;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)p_data;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)p_data;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // All other types assign constant
        // We don't bother handling support for legacy operators since they are a little too crappy. Instead we will later implement a proper expression evaluator in the future.
        sscanf(buf, format, p_data);
    }
    else
    {
        // Small types need a 32-bit buffer to receive the result from scanf()
        int v32;
        sscanf(buf, format, &v32);
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(&data_backup, p_data, type_info->Size) != 0;
}